

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

char * read_word(int wantbrace)

{
  uint __c;
  int iVar1;
  int iVar2;
  char *pcVar3;
  int length_1;
  char *pcVar4;
  int length;
  ulong uVar5;
  bool bVar6;
  
  do {
    while( true ) {
      __c = getc((FILE *)fin);
      if (((int)__c < 0) && (iVar1 = feof((FILE *)fin), iVar1 != 0)) {
        return (char *)0x0;
      }
      if (__c != 10) break;
LAB_001983e9:
      lineno = lineno + 1;
    }
    if (__c == 0x23) {
      do {
        iVar1 = getc((FILE *)fin);
        if (iVar1 < 0) break;
      } while (iVar1 != 10);
      goto LAB_001983e9;
    }
    iVar1 = isspace(__c & 0xff);
  } while (iVar1 != 0);
  expand_buffer(100);
  pcVar4 = buffer;
  if (wantbrace == 0 && __c == 0x7b) {
    uVar5 = 0;
    iVar1 = 0;
LAB_00198433:
    do {
      iVar2 = getc((FILE *)fin);
      if (iVar2 < 0) goto LAB_001984b1;
      if (iVar2 != 0x23) {
        if (iVar2 == 0x5c) {
          iVar2 = read_quoted();
          if (iVar2 < 0) goto LAB_00198433;
        }
        else if (iVar2 == 10) {
          lineno = lineno + 1;
          iVar2 = 10;
        }
        else if (iVar2 == 0x7b) {
          iVar1 = iVar1 + 1;
          iVar2 = 0x7b;
        }
        else if (iVar2 == 0x7d) {
          iVar2 = 0x7d;
          bVar6 = iVar1 == 0;
          iVar1 = iVar1 + -1;
          if (bVar6) goto LAB_0019853c;
        }
        buffer[uVar5] = (char)iVar2;
        uVar5 = uVar5 + 1;
        expand_buffer((int)uVar5);
        goto LAB_00198433;
      }
      do {
        iVar2 = getc((FILE *)fin);
        if (iVar2 < 0) break;
      } while (iVar2 != 10);
      lineno = lineno + 1;
    } while( true );
  }
  if ((__c == 0x7b) || (__c == 0x7d)) {
    *buffer = (char)__c;
    pcVar3 = pcVar4 + 1;
    goto LAB_0019853f;
  }
  uVar5 = 0;
LAB_001984cd:
  if (__c == 0x5c) goto code_r0x001984d2;
  if ((((-1 < (int)__c) && (iVar1 = isspace(__c & 0xff), iVar1 == 0)) && (__c != 0x23)) &&
     ((__c != 0x7b && (__c != 0x7d)))) goto LAB_001984fe;
  ungetc(__c,(FILE *)fin);
LAB_0019853c:
  pcVar3 = buffer + (uVar5 & 0xffffffff);
  pcVar4 = buffer;
LAB_0019853f:
  *pcVar3 = '\0';
  return pcVar4;
LAB_001984b1:
  read_error("Missing \'}\'");
  goto LAB_0019853c;
code_r0x001984d2:
  __c = read_quoted();
  if (-1 < (int)__c) {
LAB_001984fe:
    buffer[uVar5] = (char)__c;
    uVar5 = uVar5 + 1;
    expand_buffer((int)uVar5);
    __c = getc((FILE *)fin);
  }
  goto LAB_001984cd;
}

Assistant:

const char *read_word(int wantbrace) {
  int x;

  // skip all the whitespace before it:
  for (;;) {
    x = getc(fin);
    if (x < 0 && feof(fin)) {	// eof
      return 0;
    } else if (x == '#') {	// comment
      do x = getc(fin); while (x >= 0 && x != '\n');
      lineno++;
      continue;
    } else if (x == '\n') {
      lineno++;
    } else if (!isspace(x & 255)) {
      break;
    }
  }

  expand_buffer(100);

  if (x == '{' && !wantbrace) {

    // read in whatever is between braces
    int length = 0;
    int nesting = 0;
    for (;;) {
      x = getc(fin);
      if (x<0) {read_error("Missing '}'"); break;}
      else if (x == '#') { // embedded comment
	do x = getc(fin); while (x >= 0 && x != '\n');
	lineno++;
	continue;
      } else if (x == '\n') lineno++;
      else if (x == '\\') {x = read_quoted(); if (x<0) continue;}
      else if (x == '{') nesting++;
      else if (x == '}') {if (!nesting--) break;}
      buffer[length++] = x;
      expand_buffer(length);
    }
    buffer[length] = 0;
    return buffer;

  } else if (x == '{' || x == '}') {
    // all the punctuation is a word:
    buffer[0] = x;
    buffer[1] = 0;
    return buffer;

  } else {

    // read in an unquoted word:
    int length = 0;
    for (;;) {
      if (x == '\\') {x = read_quoted(); if (x<0) continue;}
      else if (x<0 || isspace(x & 255) || x=='{' || x=='}' || x=='#') break;
      buffer[length++] = x;
      expand_buffer(length);
      x = getc(fin);
    }
    ungetc(x, fin);
    buffer[length] = 0;
    return buffer;

  }
}